

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextPrecedingSibling(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr local_20;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
          (ctxt->context->node->type == XML_NAMESPACE_DECL)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((xmlDocPtr)cur == ctxt->context->doc) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (cur == (xmlNodePtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->prev;
  }
  else {
    local_20 = cur;
    if (((cur->prev == (_xmlNode *)0x0) || (cur->prev->type != XML_DTD_NODE)) ||
       (local_20 = cur->prev, local_20 != (xmlNodePtr)0x0)) {
      ctxt_local = (xmlXPathParserContextPtr)local_20->prev;
    }
    else {
      ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->prev;
    }
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextPrecedingSibling(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	(ctxt->context->node->type == XML_NAMESPACE_DECL))
	return(NULL);
    if (cur == (xmlNodePtr) ctxt->context->doc)
        return(NULL);
    if (cur == NULL)
        return(ctxt->context->node->prev);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE)) {
	cur = cur->prev;
	if (cur == NULL)
	    return(ctxt->context->node->prev);
    }
    return(cur->prev);
}